

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O0

void TvCtrlPointHandleSubscribeUpdate(char *eventURL,char *sid,int timeout)

{
  int iVar1;
  int local_2c;
  TvDeviceNode *pTStack_28;
  int service;
  TvDeviceNode *tmpdevnode;
  int timeout_local;
  char *sid_local;
  char *eventURL_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&DeviceListMutex);
  pTStack_28 = GlobalDeviceList;
  do {
    if (pTStack_28 == (TvDeviceNode *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)&DeviceListMutex);
      return;
    }
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      iVar1 = strcmp((pTStack_28->device).TvService[local_2c].EventURL,eventURL);
      if (iVar1 == 0) {
        SampleUtil_Print("Received Tv %s Event Renewal for eventURL %s\n",TvServiceName[local_2c],
                         eventURL);
        strcpy((pTStack_28->device).TvService[local_2c].SID,sid);
        break;
      }
    }
    pTStack_28 = pTStack_28->next;
  } while( true );
}

Assistant:

void TvCtrlPointHandleSubscribeUpdate(
	const char *eventURL, const Upnp_SID sid, int timeout)
{
	struct TvDeviceNode *tmpdevnode;
	int service;
	(void)timeout;

	ithread_mutex_lock(&DeviceListMutex);

	tmpdevnode = GlobalDeviceList;
	while (tmpdevnode) {
		for (service = 0; service < TV_SERVICE_SERVCOUNT; service++) {
			if (strcmp(tmpdevnode->device.TvService[service]
					    .EventURL,
				    eventURL) == 0) {
				SampleUtil_Print("Received Tv %s Event Renewal "
						 "for eventURL %s\n",
					TvServiceName[service],
					eventURL);
				strcpy(tmpdevnode->device.TvService[service]
						.SID,
					sid);
				break;
			}
		}

		tmpdevnode = tmpdevnode->next;
	}

	ithread_mutex_unlock(&DeviceListMutex);

	return;
}